

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfPost.c
# Opt level: O3

void Cnf_ManPostprocess_old(Cnf_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  
  pVVar3 = p->pManAig->vObjs;
  uVar1 = pVVar3->nSize;
  if ((long)(int)uVar1 < 1) {
    uVar6 = 0;
    uVar7 = 0;
  }
  else {
    ppvVar4 = pVVar3->pArray;
    lVar8 = 0;
    uVar7 = 0;
    uVar6 = 0;
    do {
      pvVar5 = ppvVar4[lVar8];
      if ((((pvVar5 != (void *)0x0) &&
           (uVar10 = *(ulong *)((long)pvVar5 + 0x18), (uVar10 & 0xffffffc0) != 0)) &&
          (0xfffffffd < ((uint)uVar10 & 7) - 7)) && (0x1fffffff < _DAT_00000004)) {
        uVar9 = _DAT_00000004 >> 0xf & 0xffe;
        uVar10 = 0;
        do {
          uVar2 = *(uint *)(uVar10 * 4 + 8);
          if (uVar1 <= uVar2) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          uVar2 = *(uint *)((long)ppvVar4[uVar2] + 0x18);
          if (0xfffffffd < (uVar2 & 7) - 7) {
            if (uVar2 < 0x40) {
              __assert_fail("pFan->nRefs != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfPost.c"
                            ,0x42,"void Cnf_ManPostprocess_old(Cnf_Man_t *)");
            }
            if (((uVar2 & 0xffffffc0) == 0x40) && (uVar9 != 0)) {
              uVar7 = (ulong)((int)uVar7 + uVar9);
              uVar6 = (ulong)((int)uVar6 + 1);
            }
          }
          uVar10 = uVar10 + 1;
        } while (_DAT_00000004 >> 0x1d != uVar10);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != (int)uVar1);
  }
  printf("Total gain = %d.  Vars = %d.\n",uVar7,uVar6);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cnf_ManPostprocess_old( Cnf_Man_t * p )
{
//    extern int Aig_ManLargeCutEval( Aig_Man_t * p, Aig_Obj_t * pRoot, Dar_Cut_t * pCutR, Dar_Cut_t * pCutL, int Leaf );
    int nNew, Gain, nGain = 0, nVars = 0;

    Aig_Obj_t * pObj, * pFan;
    Dar_Cut_t * pCutBest, * pCut;
    int i, k;//, a, b, Counter;
    Aig_ManForEachObj( p->pManAig, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        if ( pObj->nRefs == 0 )
            continue;
//        pCutBest = Aig_ObjBestCut(pObj);
        pCutBest = NULL;

        Dar_CutForEachLeaf( p->pManAig, pCutBest, pFan, k )
        {
            if ( !Aig_ObjIsNode(pFan) )
                continue;
            assert( pFan->nRefs != 0 );
            if ( pFan->nRefs != 1 )
                continue;
//            pCut = Aig_ObjBestCut(pFan);
            pCut = NULL;
/*
            // find how many common variable they have
            Counter = 0;
            for ( a = 0; a < (int)pCut->nLeaves; a++ )
            {
                for ( b = 0; b < (int)pCutBest->nLeaves; b++ )
                    if ( pCut->pLeaves[a] == pCutBest->pLeaves[b] )
                        break;
                if ( b == (int)pCutBest->nLeaves )
                    continue;
                Counter++;
            }
            printf( "%d ", Counter );
*/
            // find the new truth table after collapsing these two cuts


//            nNew = Aig_ManLargeCutEval( p->pManAig, pObj, pCutBest, pCut, pFan->Id );
            nNew = 0;


//            printf( "%d+%d=%d:%d(%d) ", pCutBest->Cost, pCut->Cost, 
//                pCutBest->Cost+pCut->Cost, nNew, pCutBest->Cost+pCut->Cost-nNew );

            Gain = pCutBest->Value + pCut->Value - nNew;
            if ( Gain > 0 )
            {
                nGain += Gain;
                nVars++;
            }
        }
    }
    printf( "Total gain = %d.  Vars = %d.\n", nGain, nVars );
}